

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_get_array(AMQP_VALUE value,AMQP_VALUE *array_value)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  int result;
  AMQP_VALUE *array_value_local;
  AMQP_VALUE value_local;
  
  if ((value == (AMQP_VALUE)0x0) || (array_value == (AMQP_VALUE *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_array",0x7d4,1,"Bad arguments: value = %p, array_value = %p",value,
                array_value);
    }
    l._4_4_ = 0x7d5;
  }
  else if (value->type == AMQP_TYPE_ARRAY) {
    *array_value = value;
    l._4_4_ = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_array",0x7dc,1,"Value is not of type ARRAY");
    }
    l._4_4_ = 0x7dd;
  }
  return l._4_4_;
}

Assistant:

int amqpvalue_get_array(AMQP_VALUE value, AMQP_VALUE* array_value)
{
    int result;

    if ((value == NULL) ||
        (array_value == NULL))
    {
        LogError("Bad arguments: value = %p, array_value = %p",
            value, array_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if (value_data->type != AMQP_TYPE_ARRAY)
        {
            LogError("Value is not of type ARRAY");
            result = MU_FAILURE;
        }
        else
        {
            *array_value = value;
            result = 0;
        }
    }

    return result;
}